

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall Parser::parseAddExpr(Parser *this)

{
  Parser *in_RSI;
  bool bVar1;
  unique_ptr<AST::BinaryExpr,_std::default_delete<AST::BinaryExpr>_> local_40;
  undefined1 local_38 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> right;
  undefined4 local_20;
  undefined1 local_19;
  TokenType op;
  Parser *this_local;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *expr;
  
  local_19 = '\0';
  this_local = this;
  parseMulExpr(this);
  while( true ) {
    bVar1 = true;
    if ((in_RSI->m_currToken).type != Plus) {
      bVar1 = (in_RSI->m_currToken).type == Minus;
    }
    if (!bVar1) break;
    local_20 = (in_RSI->m_currToken).type;
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    parseMulExpr((Parser *)local_38);
    std::
    make_unique<AST::BinaryExpr,TokenType&,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)&local_40,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&stack0xffffffffffffffe0,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)this);
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::operator=
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,&local_40);
    std::unique_ptr<AST::BinaryExpr,_std::default_delete<AST::BinaryExpr>_>::~unique_ptr(&local_40);
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_38);
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseAddExpr() {
    std::unique_ptr<AST::Expr> expr = parseMulExpr();
    while (m_currToken.type == TokenType::Plus || m_currToken.type == TokenType::Minus) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        std::unique_ptr<AST::Expr> right = parseMulExpr();
        expr = std::make_unique<AST::BinaryExpr>(op,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}